

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_loader.c
# Opt level: O0

void plugin_loader_destroy(plugin_loader_conflict l)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    if (*(long *)((long)in_RDI + 8) != 0) {
      free(*(void **)((long)in_RDI + 8));
    }
    if (*(long *)((long)in_RDI + 0x10) != 0) {
      free(*(void **)((long)in_RDI + 0x10));
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void plugin_loader_destroy(plugin_loader l)
{
	if (l != NULL)
	{
		if (l->library_suffix != NULL)
		{
			free(l->library_suffix);
		}

		if (l->symbol_iface_suffix != NULL)
		{
			free(l->symbol_iface_suffix);
		}

		free(l);
	}
}